

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O1

string * __thiscall
spirv_cross::CompilerGLSL::flattened_access_chain_vector_abi_cxx11_
          (string *__return_storage_ptr__,CompilerGLSL *this,uint32_t base,uint32_t *indices,
          uint32_t count,SPIRType *target_type,uint32_t offset,uint32_t matrix_stride,
          bool need_transpose)

{
  ulong uVar1;
  char cVar2;
  char cVar3;
  uint uVar4;
  SPIRType *pSVar5;
  uint uVar6;
  ulong uVar7;
  uint uVar8;
  string __str;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
  result;
  string buffer_name;
  string local_a0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_80;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
  local_78;
  undefined1 *local_50 [2];
  undefined1 local_40 [16];
  
  pSVar5 = Compiler::expression_type(&this->super_Compiler,base);
  flattened_access_chain_offset_abi_cxx11_
            (&local_78,this,pSVar5,indices,count,offset,0x10,(bool *)0x0,(uint32_t *)0x0,
             (uint32_t *)0x0,false);
  pSVar5 = Compiler::expression_type(&this->super_Compiler,base);
  (*(this->super_Compiler)._vptr_Compiler[6])
            (local_50,this,(ulong)(pSVar5->super_IVariant).self.id,1);
  if (need_transpose) {
    local_80 = &__return_storage_ptr__->field_2;
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)local_80;
    __return_storage_ptr__->_M_string_length = 0;
    (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
    if (1 < target_type->vecsize) {
      type_to_glsl_constructor_abi_cxx11_(&local_a0,this,target_type);
      ::std::__cxx11::string::_M_append
                ((char *)__return_storage_ptr__,(ulong)local_a0._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
        operator_delete(local_a0._M_dataplus._M_p);
      }
      ::std::__cxx11::string::append((char *)__return_storage_ptr__);
    }
    if (target_type->vecsize != 0) {
      uVar8 = 0;
      do {
        if (uVar8 != 0) {
          ::std::__cxx11::string::append((char *)__return_storage_ptr__);
        }
        uVar4 = uVar8 * matrix_stride + local_78.second;
        uVar6 = target_type->width >> 3;
        uVar1 = (ulong)uVar4 / (ulong)uVar6;
        if (uVar4 % uVar6 != 0) {
          __assert_fail("component_offset % (target_type.width / 8) == 0",
                        "/workspace/llm4binary/github/license_c_cmakelists/Unity-Technologies[P]SPIRV-Cross/spirv_glsl.cpp"
                        ,0x25d6,
                        "std::string spirv_cross::CompilerGLSL::flattened_access_chain_vector(uint32_t, const uint32_t *, uint32_t, const SPIRType &, uint32_t, uint32_t, bool)"
                       );
        }
        ::std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_50[0]);
        ::std::__cxx11::string::append((char *)__return_storage_ptr__);
        ::std::__cxx11::string::_M_append
                  ((char *)__return_storage_ptr__,(ulong)local_78.first._M_dataplus._M_p);
        uVar4 = (uint)uVar1;
        uVar1 = uVar1 >> 2;
        cVar3 = '\x01';
        if (0x27 < uVar4) {
          uVar7 = uVar1;
          cVar2 = '\x04';
          do {
            cVar3 = cVar2;
            uVar6 = (uint)uVar7;
            if (uVar6 < 100) {
              cVar3 = cVar3 + -2;
              goto LAB_001fe128;
            }
            if (uVar6 < 1000) {
              cVar3 = cVar3 + -1;
              goto LAB_001fe128;
            }
            if (uVar6 < 10000) goto LAB_001fe128;
            uVar7 = uVar7 / 10000;
            cVar2 = cVar3 + '\x04';
          } while (99999 < uVar6);
          cVar3 = cVar3 + '\x01';
        }
LAB_001fe128:
        local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
        ::std::__cxx11::string::_M_construct((ulong)&local_a0,cVar3);
        ::std::__detail::__to_chars_10_impl<unsigned_int>
                  (local_a0._M_dataplus._M_p,(uint)local_a0._M_string_length,(uint)uVar1);
        ::std::__cxx11::string::_M_append
                  ((char *)__return_storage_ptr__,(ulong)local_a0._M_dataplus._M_p);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
          operator_delete(local_a0._M_dataplus._M_p);
        }
        ::std::__cxx11::string::append((char *)__return_storage_ptr__);
        vector_swizzle(1,uVar4 & 3);
        ::std::__cxx11::string::append((char *)__return_storage_ptr__);
        uVar8 = uVar8 + 1;
      } while (uVar8 < target_type->vecsize);
      if (1 < target_type->vecsize) {
        ::std::__cxx11::string::append((char *)__return_storage_ptr__);
      }
    }
  }
  else {
    uVar8 = target_type->width >> 3;
    uVar1 = (ulong)local_78.second / (ulong)uVar8;
    if (local_78.second % uVar8 != 0) {
      __assert_fail("result.second % (target_type.width / 8) == 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/Unity-Technologies[P]SPIRV-Cross/spirv_glsl.cpp"
                    ,0x25eb,
                    "std::string spirv_cross::CompilerGLSL::flattened_access_chain_vector(uint32_t, const uint32_t *, uint32_t, const SPIRType &, uint32_t, uint32_t, bool)"
                   );
    }
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    __return_storage_ptr__->_M_string_length = 0;
    (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
    ::std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_50[0]);
    ::std::__cxx11::string::append((char *)__return_storage_ptr__);
    ::std::__cxx11::string::_M_append
              ((char *)__return_storage_ptr__,(ulong)local_78.first._M_dataplus._M_p);
    uVar8 = (uint)uVar1;
    uVar1 = uVar1 >> 2;
    cVar3 = '\x01';
    if (0x27 < uVar8) {
      uVar7 = uVar1;
      cVar2 = '\x04';
      do {
        cVar3 = cVar2;
        uVar4 = (uint)uVar7;
        if (uVar4 < 100) {
          cVar3 = cVar3 + -2;
          goto LAB_001fe285;
        }
        if (uVar4 < 1000) {
          cVar3 = cVar3 + -1;
          goto LAB_001fe285;
        }
        if (uVar4 < 10000) goto LAB_001fe285;
        uVar7 = uVar7 / 10000;
        cVar2 = cVar3 + '\x04';
      } while (99999 < uVar4);
      cVar3 = cVar3 + '\x01';
    }
LAB_001fe285:
    local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
    ::std::__cxx11::string::_M_construct((ulong)&local_a0,cVar3);
    ::std::__detail::__to_chars_10_impl<unsigned_int>
              (local_a0._M_dataplus._M_p,(uint)local_a0._M_string_length,(uint)uVar1);
    ::std::__cxx11::string::_M_append
              ((char *)__return_storage_ptr__,(ulong)local_a0._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
      operator_delete(local_a0._M_dataplus._M_p);
    }
    ::std::__cxx11::string::append((char *)__return_storage_ptr__);
    vector_swizzle(target_type->vecsize,uVar8 & 3);
    ::std::__cxx11::string::append((char *)__return_storage_ptr__);
  }
  if (local_50[0] != local_40) {
    operator_delete(local_50[0]);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78.first._M_dataplus._M_p != &local_78.first.field_2) {
    operator_delete(local_78.first._M_dataplus._M_p);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string CompilerGLSL::flattened_access_chain_vector(uint32_t base, const uint32_t *indices, uint32_t count,
                                                        const SPIRType &target_type, uint32_t offset,
                                                        uint32_t matrix_stride, bool need_transpose)
{
	auto result = flattened_access_chain_offset(expression_type(base), indices, count, offset, 16);

	auto buffer_name = to_name(expression_type(base).self);

	if (need_transpose)
	{
		std::string expr;

		if (target_type.vecsize > 1)
		{
			expr += type_to_glsl_constructor(target_type);
			expr += "(";
		}

		for (uint32_t i = 0; i < target_type.vecsize; ++i)
		{
			if (i != 0)
				expr += ", ";

			uint32_t component_offset = result.second + i * matrix_stride;

			assert(component_offset % (target_type.width / 8) == 0);
			uint32_t index = component_offset / (target_type.width / 8);

			expr += buffer_name;
			expr += "[";
			expr += result.first; // this is a series of N1 * k1 + N2 * k2 + ... that is either empty or ends with a +
			expr += convert_to_string(index / 4);
			expr += "]";

			expr += vector_swizzle(1, index % 4);
		}

		if (target_type.vecsize > 1)
		{
			expr += ")";
		}

		return expr;
	}
	else
	{
		assert(result.second % (target_type.width / 8) == 0);
		uint32_t index = result.second / (target_type.width / 8);

		std::string expr;

		expr += buffer_name;
		expr += "[";
		expr += result.first; // this is a series of N1 * k1 + N2 * k2 + ... that is either empty or ends with a +
		expr += convert_to_string(index / 4);
		expr += "]";

		expr += vector_swizzle(target_type.vecsize, index % 4);

		return expr;
	}
}